

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

qint64 __thiscall QSslSocket::readData(QSslSocket *this,char *data,qint64 maxlen)

{
  long lVar1;
  char cVar2;
  long lVar3;
  qint64 qVar4;
  
  lVar1 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if ((*(int *)(lVar1 + 0x270) == 0) && (*(char *)(lVar1 + 0x274) == '\0')) {
    qVar4 = QIODevice::read(*(char **)(lVar1 + 0x3f8),(longlong)data);
    return qVar4;
  }
  lVar3 = (**(code **)(**(long **)(lVar1 + 0x3f8) + 0xa0))();
  if ((lVar3 == 0) &&
     ((*(long **)(lVar1 + 0x408) == (long *)0x0 ||
      (cVar2 = (**(code **)(**(long **)(lVar1 + 0x408) + 0xd0))(), cVar2 == '\0')))) {
    if (*(int *)(lVar1 + 0x260) != 3) {
      return -(ulong)(maxlen != 0);
    }
  }
  else {
    QMetaObject::invokeMethod<>((QObject *)this,"_q_flushReadBuffer",QueuedConnection);
  }
  return 0;
}

Assistant:

qint64 QSslSocket::readData(char *data, qint64 maxlen)
{
    Q_D(QSslSocket);
    qint64 readBytes = 0;

    if (d->mode == UnencryptedMode && !d->autoStartHandshake) {
        readBytes = d->plainSocket->read(data, maxlen);
#ifdef QSSLSOCKET_DEBUG
        qCDebug(lcSsl) << "QSslSocket::readData(" << (void *)data << ',' << maxlen << ") =="
                 << readBytes;
#endif
    } else {
        // possibly trigger another transmit() to decrypt more data from the socket
        if (d->plainSocket->bytesAvailable() || d->hasUndecryptedData())
            QMetaObject::invokeMethod(this, "_q_flushReadBuffer", Qt::QueuedConnection);
        else if (d->state != QAbstractSocket::ConnectedState)
            return maxlen ? qint64(-1) : qint64(0);
    }

    return readBytes;
}